

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-walker.cpp
# Opt level: O0

int main(void)

{
  Port *pPVar1;
  Port *p;
  char buffer [1024];
  char *__rhs;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffb84;
  undefined2 in_stack_fffffffffffffbb0;
  undefined1 uVar3;
  byte bVar4;
  undefined4 in_stack_fffffffffffffbb4;
  char *in_stack_fffffffffffffbb8;
  undefined6 in_stack_fffffffffffffbc0;
  byte bVar5;
  allocator<char> in_stack_fffffffffffffbc7;
  string local_438 [8];
  char *in_stack_fffffffffffffbd0;
  Ports *in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbf6;
  __0 in_stack_fffffffffffffbf7;
  port_walker_t in_stack_fffffffffffffbf8;
  void *in_stack_fffffffffffffc00;
  size_t in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  Ports *in_stack_fffffffffffffc18;
  void *in_stack_fffffffffffffc40;
  uint local_4;
  
  memset(&stack0xfffffffffffffbf8,0,0x400);
  main::$_0::operator_cast_to_function_pointer((__0 *)&stack0xfffffffffffffbf7);
  __rhs = (char *)0x0;
  uVar2 = 0;
  rtosc::walk_ports(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                    in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                    (bool)in_stack_fffffffffffffbf7,in_stack_fffffffffffffc40,
                    (bool)in_stack_fffffffffffffbf6);
  pPVar1 = rtosc::Ports::apropos(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  bVar5 = 0;
  bVar4 = 0;
  uVar3 = false;
  if (pPVar1 != (Port *)0x0) {
    std::allocator<char>::allocator();
    bVar5 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbc7,CONCAT16(1,in_stack_fffffffffffffbc0)),
               in_stack_fffffffffffffbb8,
               (allocator<char> *)
               CONCAT44(in_stack_fffffffffffffbb4,
                        CONCAT13(bVar4,CONCAT12(uVar3,in_stack_fffffffffffffbb0))));
    bVar4 = 1;
    uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffb84,uVar2),__rhs);
  }
  if ((bVar4 & 1) != 0) {
    std::__cxx11::string::~string(local_438);
  }
  if ((bVar5 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbc7);
  }
  local_4 = (uint)((bool)uVar3 == false);
  return local_4;
}

Assistant:

int main()
{
    char buffer[1024];
    memset(buffer, 0, sizeof(buffer));
    walk_ports(&ports, 
            buffer, 1024, NULL,
            [](const Port*, const char *name, const char*,
               const Ports&, void *, void*) {
                puts(name);
            });

    const Port *p = ports.apropos("/subtree/port");

    if(p && (std::string(p->name) == "port"))
        return 0;
    return 1;
}